

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O2

error<idx2::idx2_err_code>
idx2::TraverseHierarchy
          (u64 TraverseOrder,v3i *From3,v3i *Dims3,extent *Extent,extent *VolExtent,
          traverse_callback *Callback)

{
  anon_union_8_4_6ba14846_for_v2<int>_1 *paVar1;
  v2<int> *pvVar2;
  byte *pbVar3;
  u64 uVar4;
  anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 aVar5;
  anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0 aVar6;
  undefined8 uVar7;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar8;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar9;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar10;
  v2<int> vVar11;
  v2<int> vVar12;
  v2<int> vVar13;
  v2<int> vVar14;
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined4 uVar17;
  i32 iVar18;
  int iVar19;
  i64 iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  char cVar25;
  long lVar26;
  u64 uVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  long *in_FS_OFFSET;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  error<idx2::idx2_err_code> eVar36;
  extent eVar37;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_188;
  int iStack_180;
  int aiStack_17c [2];
  int iStack_174;
  undefined3 uStack_173;
  undefined5 uStack_170;
  uint3 uStack_16b;
  undefined5 local_168;
  undefined3 uStack_163;
  undefined5 local_160;
  undefined3 uStack_15b;
  i32 local_158;
  uint local_154;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  array<idx2::traverse_item> local_138;
  extent *local_100;
  extent *local_f8;
  traverse_callback *local_f0;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Common_cpp:820:3)>
  __ScopeGuard__820;
  traverse_item Second;
  traverse_item First;
  extent Skip;
  
  local_100 = Extent;
  local_f8 = VolExtent;
  local_f0 = Callback;
  Mallocator();
  Mallocator();
  __ScopeGuard__820.Func.Stack = &local_138;
  local_138.Buffer.Data = (byte *)0x0;
  local_138.Buffer.Bytes = 0;
  local_138.Buffer.Alloc = &Mallocator::Instance.super_allocator;
  local_138.Size = 0;
  local_138.Capacity = 0;
  local_138.Alloc = &Mallocator::Instance.super_allocator;
  __ScopeGuard__820.Dismissed = false;
  GrowCapacity<idx2::traverse_item>(__ScopeGuard__820.Func.Stack,0x40);
  lVar28 = (long)(Dims3->field_0).field_0.X;
  iStack_174 = 1;
  aiStack_17c[0] = iStack_174;
  if (lVar28 != 0) {
    uVar29 = lVar28 - 1;
    lVar28 = 0x3f;
    if (uVar29 != 0) {
      for (; uVar29 >> lVar28 == 0; lVar28 = lVar28 + -1) {
      }
    }
    aiStack_17c[0] = 1;
    if (uVar29 != 0) {
      aiStack_17c[0] = (int)(1L << (-((byte)lVar28 ^ 0x3f) & 0x3f));
    }
  }
  lVar28 = (long)(Dims3->field_0).field_0.Y;
  aiStack_17c[1] = iStack_174;
  if (lVar28 != 0) {
    uVar29 = lVar28 - 1;
    lVar28 = 0x3f;
    if (uVar29 != 0) {
      for (; uVar29 >> lVar28 == 0; lVar28 = lVar28 + -1) {
      }
    }
    aiStack_17c[1] = 1;
    if (uVar29 != 0) {
      aiStack_17c[1] = (int)(1L << (-((byte)lVar28 ^ 0x3f) & 0x3f));
    }
  }
  lVar28 = (long)(Dims3->field_0).field_0.Z;
  if (lVar28 != 0) {
    uVar29 = lVar28 - 1;
    lVar28 = 0x3f;
    if (uVar29 != 0) {
      for (; uVar29 >> lVar28 == 0; lVar28 = lVar28 + -1) {
      }
    }
    if (uVar29 != 0) {
      iStack_174 = (int)(1L << (-((byte)lVar28 ^ 0x3f) & 0x3f));
    }
  }
  local_160 = 0;
  uStack_15b = 0;
  local_158 = 0;
  local_154 = local_154 & 0xffffff00;
  local_188 = (From3->field_0).field_3.XY.field_0;
  iStack_180 = (From3->field_0).field_0.Z;
  aiStack_17c[0] = aiStack_17c[0] + (From3->field_0).field_0.X;
  aiStack_17c[1] = aiStack_17c[1] + (From3->field_0).field_0.Y;
  iStack_174 = iStack_174 + (From3->field_0).field_0.Z;
  local_168 = (undefined5)TraverseOrder;
  uStack_163 = (undefined3)(TraverseOrder >> 0x28);
  iVar20 = local_138.Size;
  uStack_170 = local_168;
  uStack_16b = uStack_163;
  if (local_138.Capacity <= local_138.Size) {
    GrowCapacity<idx2::traverse_item>(&local_138,0);
    iVar20 = local_138.Size;
  }
  local_138.Size = iVar20 + 1;
  aVar8.field_0.Y = aiStack_17c[0];
  aVar8.field_0.X = iStack_180;
  aVar9.field_0.Y = iStack_174;
  aVar9.field_0.X = aiStack_17c[1];
  aVar10.field_0.Y._1_3_ = uStack_16b;
  aVar10._0_5_ = uStack_170;
  pbVar3 = local_138.Buffer.Data + iVar20 * 0x38 + 0x15;
  *(ulong *)pbVar3 = CONCAT53(uStack_170,uStack_173);
  *(ulong *)(pbVar3 + 8) = CONCAT53(local_168,uStack_16b);
  *(ulong *)(pbVar3 + 0x10) = CONCAT53(local_160,uStack_163);
  *(ulong *)(pbVar3 + 0x18) = CONCAT17((undefined1)local_154,CONCAT43(local_158,uStack_15b));
  paVar1 = (anon_union_8_4_6ba14846_for_v2<int>_1 *)(local_138.Buffer.Data + iVar20 * 0x38);
  *paVar1 = local_188;
  paVar1[1] = aVar8;
  paVar1[2] = aVar9;
  paVar1[3] = aVar10;
  do {
    while( true ) {
      do {
        lVar28 = local_138.Size + -1;
        lVar26 = lVar28 * 0x38;
        paVar1 = (anon_union_8_4_6ba14846_for_v2<int>_1 *)(local_138.Buffer.Data + lVar26);
        local_188 = *(anon_union_8_4_6ba14846_for_v2<int>_1 *)paVar1->E;
        aVar5 = paVar1[1].field_0;
        aVar6 = paVar1[3].field_0;
        uVar7 = *(undefined8 *)(local_138.Buffer.Data + lVar26 + 0x2d);
        local_168 = (undefined5)
                    ((ulong)*(undefined8 *)(local_138.Buffer.Data + lVar26 + 0x1d) >> 0x18);
        uStack_163 = (undefined3)*(undefined8 *)(local_138.Buffer.Data + lVar26 + 0x25);
        local_160 = (undefined5)
                    ((ulong)*(undefined8 *)(local_138.Buffer.Data + lVar26 + 0x25) >> 0x18);
        uStack_15b = (undefined3)uVar7;
        local_158 = (i32)((ulong)uVar7 >> 0x18);
        local_154._0_1_ = (undefined1)((ulong)uVar7 >> 0x38);
        iStack_180 = aVar5.X;
        aiStack_17c[0] = aVar5.Y;
        aiStack_17c[1] = paVar1[2].field_0.X;
        iStack_174 = paVar1[2].field_0.Y;
        uStack_170 = (undefined5)((ulong)aVar6 >> 2);
        uStack_16b = aVar6.Y._1_3_ >> 2;
        uVar21 = aVar6.X & 3;
      } while (uVar21 == 3);
      bVar33 = local_138.Size == 0;
      if (!bVar33) {
        local_138.Size = lVar28;
      }
      auVar34._4_4_ = aiStack_17c[1];
      auVar34._0_4_ = aiStack_17c[0];
      auVar34._8_8_ = 0;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_188;
      auVar34 = vpsubd_avx(auVar34,auVar35);
      auVar15._8_4_ = 1;
      auVar15._0_8_ = 0x100000001;
      auVar15._12_4_ = 1;
      auVar34 = vpcmpeqd_avx(auVar34,auVar15);
      auVar34 = vpmovsxdq_avx(auVar34);
      uVar23 = vmovmskpd_avx(auVar34);
      if ((((uVar23 & 1) != 0) && ((byte)((byte)uVar23 >> 1) != 0)) &&
         (iStack_174 - iStack_180 == 1)) break;
      First.PrevTraverseOrder._0_5_ = local_168;
      First.PrevTraverseOrder._5_3_ = uStack_163;
      First.Address._0_5_ = local_160;
      First.Address._5_3_ = uStack_15b;
      First.ItemOrder = local_158;
      First._52_4_ = local_154;
      First.From3.field_0.field_3.XY.field_0 = (v2<int>)(v2<int>)local_188;
      First._8_8_ = aVar5;
      First.TraverseOrder._0_5_ = uStack_170;
      First.TraverseOrder._5_3_ = uStack_16b;
      Second.PrevTraverseOrder._0_5_ = local_168;
      Second.PrevTraverseOrder._5_3_ = uStack_163;
      Second.Address._0_5_ = local_160;
      Second.Address._5_3_ = uStack_15b;
      Second.ItemOrder = local_158;
      Second._52_4_ = local_154;
      Second.From3.field_0.field_3.XY.field_0 = (v2<int>)(v2<int>)local_188;
      Second._8_8_ = aVar5;
      Second.TraverseOrder._0_5_ = uStack_170;
      Second.TraverseOrder._5_3_ = uStack_16b;
      uVar29 = (ulong)(uVar21 << 2);
      iVar19 = (*(int *)((long)aiStack_17c + uVar29) - *(int *)((long)&local_188 + uVar29)) / 2 +
               *(int *)((long)&local_188 + uVar29);
      First.To3.field_0.field_0.Y = aiStack_17c[1];
      First.To3.field_0.field_0.Z = iStack_174;
      *(int *)((long)&First.To3.field_0 + uVar29) = iVar19;
      Second.To3.field_0.field_0.Y = aiStack_17c[1];
      Second.To3.field_0.field_0.Z = iStack_174;
      *(int *)((long)&Second.From3.field_0 + uVar29) = iVar19;
      iVar18 = First.ItemOrder;
      uVar16 = First.From3.field_0.field_0.X;
      uVar17 = First.From3.field_0.field_0.Y;
      local_140 = First.To3.field_0.field_0.X;
      uVar21 = First.To3.field_0.field_0.X - First.From3.field_0._0_4_;
      local_144 = First.To3.field_0.field_0.Y;
      uVar23 = First.To3.field_0.field_0.Y - First.From3.field_0._4_4_;
      local_148 = First.To3.field_0.field_0.Z;
      uVar32 = First.To3.field_0.field_0.Z - First.From3.field_0._8_4_;
      local_13c = First.From3.field_0.field_0.Z;
      Skip.From = (ulong)(First.From3.field_0.field_0.Z & 0x1fffff) << 0x2a |
                  ((ulong)(uint)First.From3.field_0.field_0.Y & 0x1fffff) << 0x15 |
                  (ulong)First.From3.field_0.field_3.XY.field_0 & 0x1fffff;
      Skip.Dims = (ulong)(uVar32 & 0x1fffff) << 0x2a |
                  (ulong)(uVar23 & 0x1fffff) << 0x15 | (ulong)(uVar21 & 0x1fffff);
      eVar37 = Crop<idx2::extent,idx2::extent>(&Skip,local_f8);
      Second.ItemOrder =
           (((int)eVar37.Dims << 0xb) >> 0xb) * (int)((long)(eVar37.Dims * 2) >> 0x2b) *
           (int)((long)(eVar37.Dims << 0x16) >> 0x2b) + iVar18;
      First.Address._0_5_ = local_160;
      First.Address._5_3_ = uStack_15b;
      lVar28 = (long)(int)uVar32 * (long)(int)uVar23 * (long)(int)uVar21 +
               CONCAT35(uStack_15b,local_160);
      Second.Address._0_5_ = (undefined5)lVar28;
      Second.Address._5_3_ = (undefined3)((ulong)lVar28 >> 0x28);
      uVar4 = local_100->From;
      uVar27 = local_100->Dims;
      iVar22 = (int)((long)(uVar4 << 0x2b) >> 0x2b);
      iVar19 = (int)((long)(uVar4 * 2) >> 0x2b);
      iVar24 = (int)((long)(uVar4 << 0x16) >> 0x2b);
      iVar30 = (int)(((long)(uVar27 << 0x16) >> 0xb) +
                     ((long)(uVar4 << 0x16) >> 0xb & 0xffffffff00000000U) >> 0x20);
      iVar31 = (((int)uVar27 << 0xb) >> 0xb) + iVar22;
      if ((((Second.From3.field_0.field_0.X < iVar31) && (Second.From3.field_0.field_0.Y < iVar30))
          && ((Second.From3.field_0.field_0.Z < (int)((long)(uVar27 * 2) >> 0x2b) + iVar19 &&
              ((iVar22 < Second.To3.field_0.field_0.X && (iVar24 < Second.To3.field_0.field_0.Y)))))
          ) && (iVar19 < Second.To3.field_0.field_0.Z)) {
        iVar20 = local_138.Size;
        if (local_138.Capacity <= local_138.Size) {
          GrowCapacity<idx2::traverse_item>(&local_138,0);
          iVar20 = local_138.Size;
        }
        local_138.Size = iVar20 + 1;
        vVar11.field_0.field_0.Y = Second.To3.field_0.field_0.Z;
        vVar11.field_0.field_0.X = Second.To3.field_0.field_0.Y;
        vVar12.field_0.field_0.Y._1_3_ = Second.TraverseOrder._5_3_;
        vVar12.field_0._0_5_ = (undefined5)Second.TraverseOrder;
        pbVar3 = local_138.Buffer.Data + iVar20 * 0x38 + 0x15;
        *(ulong *)pbVar3 =
             CONCAT53((undefined5)Second.TraverseOrder,Second.To3.field_0.field_0.Z._1_3_);
        *(ulong *)(pbVar3 + 8) =
             CONCAT53((undefined5)Second.PrevTraverseOrder,Second.TraverseOrder._5_3_);
        *(ulong *)(pbVar3 + 0x10) =
             CONCAT53((undefined5)Second.Address,Second.PrevTraverseOrder._5_3_);
        *(ulong *)(pbVar3 + 0x18) =
             CONCAT17(Second.LastItem,CONCAT43(Second.ItemOrder,Second.Address._5_3_));
        pvVar2 = (v2<int> *)(local_138.Buffer.Data + iVar20 * 0x38);
        pvVar2->field_0 =
             (anon_union_8_4_6ba14846_for_v2<int>_1)Second.From3.field_0.field_3.XY.field_0;
        pvVar2[1].field_0 = (anon_union_8_4_6ba14846_for_v2<int>_1)Second._8_8_;
        pvVar2[2].field_0 = vVar11.field_0;
        pvVar2[3].field_0 = vVar12.field_0;
        uVar4 = local_100->From;
        uVar27 = local_100->Dims;
        iVar22 = (int)((long)(uVar4 << 0x2b) >> 0x2b);
        iVar19 = (int)((long)(uVar4 * 2) >> 0x2b);
        iVar24 = (int)((long)(uVar4 << 0x16) >> 0x2b);
        iVar30 = (int)(((long)(uVar27 << 0x16) >> 0xb) +
                       ((long)(uVar4 << 0x16) >> 0xb & 0xffffffff00000000U) >> 0x20);
        iVar31 = (((int)uVar27 << 0xb) >> 0xb) + iVar22;
      }
      if ((((((int)uVar16 < iVar31) && ((int)uVar17 < iVar30)) &&
           (local_13c < (int)((long)(uVar27 * 2) >> 0x2b) + iVar19)) &&
          ((iVar22 < local_140 && (iVar24 < local_144)))) && (iVar19 < local_148)) {
        iVar20 = local_138.Size;
        if (local_138.Capacity <= local_138.Size) {
          GrowCapacity<idx2::traverse_item>(&local_138,0);
          iVar20 = local_138.Size;
        }
        local_138.Size = iVar20 + 1;
        vVar13.field_0.field_0.Y = First.To3.field_0.field_0.Z;
        vVar13.field_0.field_0.X = First.To3.field_0.field_0.Y;
        vVar14.field_0.field_0.Y._1_3_ = First.TraverseOrder._5_3_;
        vVar14.field_0._0_5_ = (undefined5)First.TraverseOrder;
        pbVar3 = local_138.Buffer.Data + iVar20 * 0x38 + 0x15;
        *(ulong *)pbVar3 =
             CONCAT53((undefined5)First.TraverseOrder,First.To3.field_0.field_0.Z._1_3_);
        *(ulong *)(pbVar3 + 8) =
             CONCAT53((undefined5)First.PrevTraverseOrder,First.TraverseOrder._5_3_);
        *(ulong *)(pbVar3 + 0x10) =
             CONCAT53((undefined5)First.Address,First.PrevTraverseOrder._5_3_);
        *(ulong *)(pbVar3 + 0x18) =
             CONCAT17(First.LastItem,CONCAT43(First.ItemOrder,First.Address._5_3_));
        pvVar2 = (v2<int> *)(local_138.Buffer.Data + iVar20 * 0x38);
        pvVar2->field_0 =
             (anon_union_8_4_6ba14846_for_v2<int>_1)First.From3.field_0.field_3.XY.field_0;
        pvVar2[1].field_0 = (anon_union_8_4_6ba14846_for_v2<int>_1)First._8_8_;
        pvVar2[2].field_0 = vVar13.field_0;
        pvVar2[3].field_0 = vVar14.field_0;
      }
    }
    local_154 = CONCAT31(local_154._1_3_,bVar33 || lVar28 == 0);
    eVar36 = (*local_f0)((traverse_item *)&local_188.field_0);
  } while (eVar36.Code == NoError);
  uVar29 = eVar36._8_8_ >> 8 & 0xffffff;
  cVar25 = (char)uVar29;
  if (cVar25 < '@') {
    uVar21 = eVar36._8_4_ & 0xff00ff | ((int)uVar29 + 1U & 0xff) << 8;
    *(undefined4 *)(*in_FS_OFFSET + -0x97c + (long)cVar25 * 4) = 0x35d;
    *(char **)(*in_FS_OFFSET + -0xb78 + (long)cVar25 * 8) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
    ;
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp:820:3)>
    ::~scope_guard(&__ScopeGuard__820);
    eVar36.Code = (char)uVar21;
    eVar36.StackIdx = (char)(uVar21 >> 8);
    eVar36.StrGened = (bool)(char)(uVar21 >> 0x10);
    eVar36._11_1_ = (char)(uVar21 >> 0x18);
    eVar36._12_4_ = 0;
    return eVar36;
  }
  __assert_fail("false && \"stack too deep\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                ,0x35d,
                "auto idx2::TraverseHierarchy(u64, const v3i &, const v3i &, const extent &, const extent &, traverse_callback *)::(anonymous class)::operator()() const"
               );
}

Assistant:

error<idx2_err_code>
TraverseHierarchy(u64 TraverseOrder,
                  const v3i& From3,
                  const v3i& Dims3,
                  const extent& Extent, // in units of traverse_item
                  const extent& VolExtent, // in units of traverse_item
                  traverse_callback Callback)
{
  idx2_RAII(array<traverse_item>, Stack, Reserve(&Stack, 64), Dealloc(&Stack));
  v3i Dims3Ext((int)NextPow2(Dims3.X), (int)NextPow2(Dims3.Y), (int)NextPow2(Dims3.Z));
  traverse_item Top;
  Top.From3 = From3;
  Top.To3 = From3 + Dims3Ext;
  Top.TraverseOrder = Top.PrevTraverseOrder = TraverseOrder;
  PushBack(&Stack, Top);
  while (Size(Stack) >= 0)
  {
    Top = Back(Stack);
    int FD = Top.TraverseOrder & 0x3;
    Top.TraverseOrder >>= 2;
    if (FD == 3)
    {
      if (Top.TraverseOrder == 3)
        Top.TraverseOrder = Top.PrevTraverseOrder;
      else
        Top.PrevTraverseOrder = Top.TraverseOrder;
      continue;
    }
    PopBack(&Stack);
    if (!(Top.To3 - Top.From3 == 1))
    {
      traverse_item First = Top, Second = Top;
      First.To3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      Second.From3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      extent Skip(First.From3, First.To3 - First.From3);
      //Second.NItemsBefore = First.NItemsBefore + Prod<u64>(Dims(Crop(Skip, Extent)));
      Second.ItemOrder = First.ItemOrder + Prod<i32>(Dims(Crop(Skip, VolExtent)));
      First.Address = Top.Address;
      Second.Address = Top.Address + Prod<u64>(First.To3 - First.From3);
      if (Second.From3 < To(Extent) && From(Extent) < Second.To3)
        PushBack(&Stack, Second);
      if (First.From3 < To(Extent) && From(Extent) < First.To3)
        PushBack(&Stack, First);
    }
    else
    {
      Top.LastItem = Size(Stack) == 0;
      idx2_PropagateIfError(Callback(Top));
    }
  }
}